

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentfragment.cpp
# Opt level: O3

void __thiscall
QTextDocumentFragment::QTextDocumentFragment(QTextDocumentFragment *this,QTextDocument *document)

{
  QTextDocumentFragmentPrivate *this_00;
  long in_FS_OFFSET;
  QTextCursor cursor;
  QTextCursor local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->d = (QTextDocumentFragmentPrivate *)0x0;
  if (document != (QTextDocument *)0x0) {
    local_28.d.d.ptr = (QSharedDataPointer<QTextCursorPrivate>)&DAT_aaaaaaaaaaaaaaaa;
    QTextCursor::QTextCursor(&local_28,document);
    QTextCursor::movePosition(&local_28,End,KeepAnchor,1);
    this_00 = (QTextDocumentFragmentPrivate *)operator_new(0x18);
    QTextDocumentFragmentPrivate::QTextDocumentFragmentPrivate(this_00,&local_28);
    this->d = this_00;
    QTextCursor::~QTextCursor(&local_28);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextDocumentFragment::QTextDocumentFragment(const QTextDocument *document)
    : d(nullptr)
{
    if (!document)
        return;

    QTextCursor cursor(const_cast<QTextDocument *>(document));
    cursor.movePosition(QTextCursor::End, QTextCursor::KeepAnchor);
    d = new QTextDocumentFragmentPrivate(cursor);
}